

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

size_t filter_letters(char *from,char *to)

{
  byte bVar1;
  size_t o;
  
  o = 0;
  for (; bVar1 = *from, bVar1 != 0; from = (char *)((byte *)from + 1)) {
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
      to[o] = bVar1;
      o = o + 1;
    }
  }
  to[o] = '\0';
  return o;
}

Assistant:

size_t filter_letters(const char* from, char* to) {
  size_t o = 0;
  for (size_t n = 0; from[n]; n++) {
    if ((from[n] >= 'A' && from[n] <= 'Z') || (from[n] >= 'a' && from[n] <= 'z')) {
      to[o++] = from[n];
    }
  }
  to[o] = 0;
  return o;
}